

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::ComputeShape
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,TPZVec<double> *qsi,
          TPZMaterialData *data)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  TPZCompMesh *pTVar5;
  TPZGeoEl *pTVar6;
  double *pdVar7;
  pair<int,_long> *this_00;
  TPZManVector<std::pair<int,_long>,_20> *in_RDX;
  undefined8 in_RSI;
  double *in_RDI;
  TPZMatrix<double> *in_stack_00000008;
  TPZFMatrix<double> *in_stack_00000010;
  int i_1;
  TPZShapeData *shapedata;
  int d;
  int i;
  TPZFNMatrix<9,_double> gradxlocal;
  TPZFMatrix<double> gradx;
  TPZFNMatrix<9,_double> axeslocal;
  int dim;
  int64_t numvec;
  int64_t nvecshapecollpased;
  int64_t nvec_bottom;
  int64_t nvec_top;
  int bottomorder;
  int toporder;
  TPZConnect *conntop;
  TPZConnect *connbot;
  TPZFMatrix<double> *in_stack_000072c8;
  TPZFMatrix<double> *in_stack_000072d0;
  TPZShapeData *in_stack_000072d8;
  TPZVec<double> *in_stack_000072e0;
  TPZCompEl *in_stack_fffffffffffffcc8;
  _func_int **in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcd8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffce0;
  int opt;
  TPZFMatrix<double> *B;
  TPZFMatrix<double> *in_stack_fffffffffffffd18;
  TPZFMatrix<double> *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  TPZManVector<std::pair<int,_long>,_20> *this_01;
  int in_stack_fffffffffffffd38;
  undefined1 local_1d8 [120];
  TPZCompEl *in_stack_fffffffffffffea0;
  TPZFMatrix<double> local_138;
  undefined4 local_54;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  uint local_30;
  uint local_2c;
  TPZConnect *local_28;
  TPZConnect *local_20;
  TPZManVector<std::pair<int,_long>,_20> *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar5 = TPZCompEl::Mesh(in_stack_fffffffffffffea0);
  TPZCompMesh::ConnectVec(pTVar5);
  local_20 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffce0,
                        (int64_t)in_stack_fffffffffffffcd8);
  pTVar5 = TPZCompEl::Mesh(in_stack_fffffffffffffea0);
  TPZCompMesh::ConnectVec(pTVar5);
  local_28 = TPZChunkVector<TPZConnect,_10>::operator[]
                       ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffce0,
                        (int64_t)in_stack_fffffffffffffcd8);
  bVar2 = TPZConnect::Order(local_28);
  local_2c = (uint)bVar2;
  bVar2 = TPZConnect::Order(local_20);
  local_30 = (uint)bVar2;
  uVar3 = TPZConnect::NShape(local_28);
  local_38 = (ulong)uVar3;
  uVar3 = TPZConnect::NShape(local_20);
  local_40 = (ulong)uVar3;
  iVar4 = (**(code **)((long)*in_RDI + 600))();
  local_48 = (long)iVar4;
  local_50 = (local_48 - local_38) - local_40;
  local_54 = 2;
  B = &local_138;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
             (int64_t)in_stack_fffffffffffffcd0);
  ExpandAxes(in_stack_00000010,in_stack_00000008);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,(int64_t)B,in_RDI);
  pTVar6 = TPZCompEl::Reference(in_stack_fffffffffffffcc8);
  (**(code **)(*(long *)pTVar6 + 0x230))(pTVar6,local_10,local_1d8);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
             (int64_t)in_stack_fffffffffffffcd0);
  for (iVar4 = 0; opt = (int)((ulong)in_RDI >> 0x20), iVar4 < 3; iVar4 = iVar4 + 1) {
    for (in_stack_fffffffffffffd38 = 0; in_stack_fffffffffffffd38 < 1;
        in_stack_fffffffffffffd38 = in_stack_fffffffffffffd38 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
      *pdVar7 = dVar1;
    }
    in_stack_fffffffffffffce0 =
         (TPZFNMatrix<9,_double> *)
         TPZFMatrix<double>::operator()
                   (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,
                    (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffcd0 =
         (in_stack_fffffffffffffce0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
         super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
    in_stack_fffffffffffffcd8 =
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)in_stack_fffffffffffffce0,
                    (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
    *in_stack_fffffffffffffcd8 = (double)in_stack_fffffffffffffcd0;
  }
  this_01 = local_18;
  TPZShapeHDivCollapsed<pzshape::TPZShapeLinear>::Shape
            (in_stack_000072e0,in_stack_000072d8,in_stack_000072d0,in_stack_000072c8);
  TPZFMatrix<double>::operator*=
            (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,(double)in_stack_fffffffffffffcd8)
  ;
  TPZMatrix<double>::Multiply
            (&in_stack_fffffffffffffd20->super_TPZMatrix<double>,in_stack_fffffffffffffd18,B,opt);
  TPZFMatrix<double>::operator*=
            (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,(double)in_stack_fffffffffffffcd8)
  ;
  TPZManVector<std::pair<int,_long>,_20>::Resize
            (this_01,CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  TPZFMatrix<double>::Resize
            ((TPZFMatrix<double> *)CONCAT44(iVar4,in_stack_fffffffffffffd38),(int64_t)this_01,
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  for (iVar4 = 0; iVar4 < local_48; iVar4 = iVar4 + 1) {
    std::pair<int,_long>::pair<int_&,_int_&,_true>
              ((pair<int,_long> *)&stack0xfffffffffffffd18,(int *)&stack0xfffffffffffffd2c,
               (int *)&stack0xfffffffffffffd2c);
    this_00 = TPZVec<std::pair<int,_long>_>::operator[]
                        ((TPZVec<std::pair<int,_long>_> *)(local_18[0x30].fExtAlloc + 10),
                         (long)iVar4);
    std::pair<int,_long>::operator=(this_00,(type)&stack0xfffffffffffffd18);
    pdVar7 = TPZFMatrix<double>::operator()
                       ((TPZFMatrix<double> *)(local_18[0x29].fExtAlloc + 8),(long)iVar4);
    *pdVar7 = 1.0;
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a638fd);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1a6390a);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a63917);
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data) {


    // Some variable definitions
    TPZConnect& connbot = this->Mesh()->ConnectVec()[fbottom_c_index];
    TPZConnect& conntop = this->Mesh()->ConnectVec()[ftop_c_index];
    const int toporder = conntop.Order();
    const int bottomorder = connbot.Order();
    const int64_t nvec_top = conntop.NShape();
    const int64_t nvec_bottom = connbot.NShape();
    const int64_t nvecshapecollpased = this->NShapeF();
    const int64_t numvec = nvecshapecollpased - nvec_top - nvec_bottom;
    const int dim = TSHAPE::Dimension+1;
    
    // Expanding element axes
    TPZFNMatrix<9,REAL> axeslocal(TSHAPE::Dimension+1,3);
    ExpandAxes(data.axes, axeslocal);
    
    // adding a column do gradx pointing to the normal direction (direction that communicates with the 3d neighbor element)
    TPZFMatrix<REAL> gradx(3,TSHAPE::Dimension,0.);
    this->Reference()->GradX(qsi, gradx);
    TPZFNMatrix<9> gradxlocal(3,dim);
    for (int i=0; i<3; i++) {
        for (int d=0; d<dim-1; d++) {
            gradxlocal(i,d) = gradx(i,d);
        }
        gradxlocal(i,dim-1) = axeslocal(dim-1,i);
    }
    
    // Computing shape functions using TPZShapeHDivCollapsed structure
    TPZShapeData& shapedata = data;
    TPZShapeHDivCollapsed<TSHAPE>::Shape(qsi,shapedata,data.phi,data.divphi);
    data.divphi *= 1./data.detjac;
    gradxlocal.Multiply(data.phi,data.fDeformedDirections);
    data.fDeformedDirections *= 1./data.detjac;
    
    // Filling phi with 1 and fVecShapeIndex with 1,1 to make actual materials work
    data.fVecShapeIndex.Resize(nvecshapecollpased);
    data.phi.Resize(nvecshapecollpased,1);
    for(int i=0; i<nvecshapecollpased; i++)
    {
        data.fVecShapeIndex[i] = std::pair<int,int64_t>(i,i);
        data.phi(i) = 1.;
    }
}